

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deffunc.cpp
# Opt level: O0

ObjectPtr __thiscall ICM::DefFunc::Lists::Mul::func(Mul *this,DataList *list)

{
  bool bVar1;
  Object **ppOVar2;
  unsigned_long *puVar3;
  Object *obj;
  lightlist<ICM::Object_*> *in_RDX;
  ListType local_d0;
  Object **local_b8;
  Object **local_b0;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
  local_a8;
  __normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
  local_a0;
  const_iterator local_98;
  unsigned_long local_90;
  size_t i;
  RIterator<unsigned_long> __end3;
  RIterator<unsigned_long> __begin3;
  unsigned_long local_68 [2];
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> local_58;
  RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_> *local_48;
  Range<unsigned_long> *__range3;
  vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> nl;
  Ty<17UL> *l;
  DataList *list_local;
  Mul *this_local;
  
  ppOVar2 = Common::lightlist<ICM::Object_*>::operator[](in_RDX,0);
  nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)Object::get<17ul>(*ppOVar2);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&__range3);
  local_68[1] = 0;
  ppOVar2 = Common::lightlist<ICM::Object_*>::operator[](in_RDX,1);
  puVar3 = (unsigned_long *)Object::dat<8ul>(*ppOVar2);
  local_68[0] = *puVar3;
  Common::Range<unsigned_long>::Range((Range<unsigned_long> *)&local_58,local_68 + 1,local_68);
  local_48 = &local_58;
  __end3 = Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::begin(local_48);
  i = (size_t)Common::RangeBase<unsigned_long,_Common::RIterator<unsigned_long>_>::end(local_48);
  while( true ) {
    bVar1 = Common::RIterator<unsigned_long>::operator!=(&__end3,(RIterator<unsigned_long> *)&i);
    if (!bVar1) break;
    local_90 = Common::RIterator<unsigned_long>::operator*(&__end3);
    local_a0._M_current =
         (Object **)
         std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::end
                   ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&__range3);
    __gnu_cxx::
    __normal_iterator<ICM::Object*const*,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>::
    __normal_iterator<ICM::Object**>
              ((__normal_iterator<ICM::Object*const*,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>
                *)&local_98,&local_a0);
    local_a8._M_current =
         (Object **)
         TypeBase::ListType::begin
                   ((ListType *)
                    nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_b0 = (Object **)
               TypeBase::ListType::end
                         ((ListType *)
                          nl.super__Vector_base<ICM::Object_*,_std::allocator<ICM::Object_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
    local_b8 = (Object **)
               std::vector<ICM::Object*,std::allocator<ICM::Object*>>::
               insert<__gnu_cxx::__normal_iterator<ICM::Object**,std::vector<ICM::Object*,std::allocator<ICM::Object*>>>,void>
                         ((vector<ICM::Object*,std::allocator<ICM::Object*>> *)&__range3,local_98,
                          local_a8,(__normal_iterator<ICM::Object_**,_std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>_>
                                    )local_b0);
    Common::RIterator<unsigned_long>::operator++(&__end3);
  }
  obj = (Object *)operator_new(0x10);
  TypeBase::ListType::ListType(&local_d0,(DataList *)&__range3);
  Objects::DataObject<(ICM::DefaultType)17>::DataObject
            ((DataObject<(ICM::DefaultType)17> *)obj,&local_d0);
  ObjectPtr::ObjectPtr((ObjectPtr *)this,obj);
  TypeBase::ListType::~ListType(&local_d0);
  std::vector<ICM::Object_*,_std::allocator<ICM::Object_*>_>::~vector
            ((vector<ICM::Object_*,_std::allocator<ICM::Object_*>_> *)&__range3);
  return (ObjectPtr)(Object *)this;
}

Assistant:

ObjectPtr func(const DataList &list) const {
					auto &l = *list[0]->get<T_List>();
					vector<Object*> nl;
					for (size_t i : Range<size_t>(0, (size_t)list[1]->dat<T_Number>()/*->getNum()*/)) {
						nl.insert(nl.end(), l.begin(), l.end());
					}
					return ObjectPtr(new List(ListType(nl)));
				}